

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

XmlWriter * __thiscall Catch::XmlWriter::endElement(XmlWriter *this)

{
  pointer pbVar1;
  pointer pcVar2;
  ostream *poVar3;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  if (this->m_needsNewline == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->m_os,"\n",1);
    this->m_needsNewline = false;
  }
  std::__cxx11::string::substr((ulong)local_38,(ulong)&this->m_indent);
  std::__cxx11::string::operator=((string *)&this->m_indent,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  if (this->m_tagIsOpen == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->m_os,"/>\n",3);
    this->m_tagIsOpen = false;
  }
  else {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->m_os,(this->m_indent)._M_dataplus._M_p,
                        (this->m_indent)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</",2);
    pbVar1 = (this->m_tags).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,pbVar1[-1]._M_dataplus._M_p,pbVar1[-1]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,">\n",2);
  }
  pbVar1 = (this->m_tags).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_tags).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
  pcVar2 = pbVar1[-1]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &pbVar1[-1].field_2) {
    operator_delete(pcVar2);
  }
  return this;
}

Assistant:

XmlWriter& endElement() {
            newlineIfNecessary();
            m_indent = m_indent.substr( 0, m_indent.size()-2 );
            if( m_tagIsOpen ) {
                stream() << "/>\n";
                m_tagIsOpen = false;
            }
            else {
                stream() << m_indent << "</" << m_tags.back() << ">\n";
            }
            m_tags.pop_back();
            return *this;
        }